

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall soul::heart::Printer::PrinterStream::printValue(PrinterStream *this,Value *v)

{
  Category CVar1;
  Primitive PVar2;
  CodePrinter *this_00;
  size_t sVar3;
  string_view text;
  char s [2];
  Printer p;
  char local_82 [2];
  string local_80;
  ValuePrinter local_60;
  CodePrinter *local_50;
  string local_48;
  
  this_00 = this->out;
  local_60.dictionary = (StringDictionary *)0x0;
  local_60._vptr_ValuePrinter = (_func_int **)&PTR__ValuePrinter_00307740;
  PVar2 = (v->type).primitiveType.type;
  CVar1 = (v->type).category;
  local_50 = this_00;
  if ((1 < PVar2 - int32 || CVar1 != primitive) &&
     ((PVar2 & ~void_) != float32 || CVar1 != primitive)) {
    getTypeDescription_abi_cxx11_(&local_48,this,&v->type);
    text._M_str = local_48._M_dataplus._M_p;
    text._M_len = local_48._M_string_length;
    choc::text::CodePrinter::writeBlock(this_00,text);
    local_82[0] = ' ';
    local_82[1] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    sVar3 = strlen(local_82);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,local_82,local_82 + sVar3);
    choc::text::CodePrinter::append(this_00,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_60.dictionary = &((this->module->program).pimpl)->stringDictionary;
  }
  soul::Value::print(v,&local_60);
  return;
}

Assistant:

void printValue (const Value& v)
        {
            struct Printer  : public ValuePrinter
            {
                Printer (choc::text::CodePrinter& s) : outStream (s) {}

                void print (std::string_view s) override    { outStream << s; }
                void printFloat32 (float value) override    { if (value == 0) print ("0.0f"); else ValuePrinter::printFloat32 (value); }
                void printFloat64 (double value) override   { if (value == 0) print ("0.0");  else ValuePrinter::printFloat64 (value); }

                void printStringLiteral (StringDictionary::Handle h) override
                {
                    print (dictionary != nullptr ? toHeartStringLiteral (dictionary->getStringForHandle (h))
                                                 : std::to_string (h.handle));
                }

                choc::text::CodePrinter& outStream;
            };

            Printer p { out };

            if (! (v.getType().isPrimitiveInteger() || v.getType().isPrimitiveFloat()))
            {
                out << getTypeDescription (v.getType()) << ' ';
                p.dictionary = std::addressof (module.program.getStringDictionary());
            }

            v.print (p);
        }